

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

void __thiscall Assimp::Importer::SetProgressHandler(Importer *this,ProgressHandler *pHandler)

{
  ImporterPimpl *pIVar1;
  ProgressHandler *pPVar2;
  
  if (pHandler == (ProgressHandler *)0x0) {
    pPVar2 = (ProgressHandler *)operator_new(8);
    pPVar2->_vptr_ProgressHandler = (_func_int **)&PTR__ProgressHandler_00729a58;
    this->pimpl->mProgressHandler = pPVar2;
    this->pimpl->mIsDefaultProgressHandler = true;
  }
  else {
    pIVar1 = this->pimpl;
    pPVar2 = pIVar1->mProgressHandler;
    if (pPVar2 != pHandler) {
      if (pPVar2 != (ProgressHandler *)0x0) {
        (*pPVar2->_vptr_ProgressHandler[1])();
        pIVar1 = this->pimpl;
      }
      pIVar1->mProgressHandler = pHandler;
      this->pimpl->mIsDefaultProgressHandler = false;
    }
  }
  return;
}

Assistant:

void Importer::SetProgressHandler ( ProgressHandler* pHandler ) {
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // If the new handler is zero, allocate a default implementation.
    if (!pHandler)
    {
        // Release pointer in the possession of the caller
        pimpl->mProgressHandler = new DefaultProgressHandler();
        pimpl->mIsDefaultProgressHandler = true;
    }
    // Otherwise register the custom handler
    else if (pimpl->mProgressHandler != pHandler)
    {
        delete pimpl->mProgressHandler;
        pimpl->mProgressHandler = pHandler;
        pimpl->mIsDefaultProgressHandler = false;
    }
    ASSIMP_END_EXCEPTION_REGION(void);
}